

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::update_listen_interfaces(session_impl *this)

{
  pointer plVar1;
  pointer plVar2;
  session_impl *this_00;
  pointer pbVar3;
  string *psVar4;
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  *in;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *e;
  pointer args;
  socket_type_t local_a2;
  operation_t local_a1;
  error_code_enum local_a0 [2];
  aux *local_98;
  session_impl *local_90;
  undefined1 local_88 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  err;
  string net_interfaces;
  
  psVar4 = session_settings::get_str_abi_cxx11_(&this->m_settings,5);
  ::std::__cxx11::string::string((string *)&net_interfaces,(string *)psVar4);
  err.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  err.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  err.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  parse_listen_interfaces
            ((vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
              *)local_88,(string *)&net_interfaces,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&err);
  local_98 = (aux *)&this->m_listen_interfaces;
  ::std::
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ::_M_move_assign((vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
                    *)local_98,
                   (vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
                    *)local_88);
  ::std::
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ::~vector((vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
             *)local_88);
  pbVar3 = err.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_90 = this;
  for (args = err.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start; this_00 = local_90, args != pbVar3;
      args = args + 1) {
    local_78._M_allocated_capacity = 0;
    local_78._8_8_ = 0;
    local_a0[1] = 0;
    local_88._0_8_ = (pointer)0x0;
    local_88._8_8_ = (pointer)0x0;
    local_a1 = parse_address;
    local_a0[0] = invalid_port;
    local_a2 = tcp;
    alert_manager::
    emplace_alert<libtorrent::listen_failed_alert,std::__cxx11::string_const&,boost::asio::ip::address,int,libtorrent::operation_t,libtorrent::errors::error_code_enum,libtorrent::socket_type_t>
              (&this->m_alerts,args,(address *)local_88,(int *)(local_a0 + 1),&local_a1,local_a0,
               &local_a2);
  }
  if (((local_90->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
    session_log(local_90,"update listen interfaces: %s",net_interfaces._M_dataplus._M_p);
    plVar1 = (this_00->m_listen_interfaces).
             super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
             ._M_impl.super__Vector_impl_data._M_start;
    plVar2 = (this_00->m_listen_interfaces).
             super__Vector_base<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    print_listen_interfaces_abi_cxx11_((string *)local_88,local_98,in);
    session_log(this_00,"parsed listen interfaces count: %d, ifaces: %s",
                ((long)plVar2 - (long)plVar1) / 0x28 & 0xffffffff,local_88._0_8_);
    ::std::__cxx11::string::~string((string *)local_88);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&err);
  ::std::__cxx11::string::~string((string *)&net_interfaces);
  return;
}

Assistant:

void session_impl::update_listen_interfaces()
	{
		INVARIANT_CHECK;

		std::string const net_interfaces = m_settings.get_str(settings_pack::listen_interfaces);
		std::vector<std::string> err;
		m_listen_interfaces = parse_listen_interfaces(net_interfaces, err);

		for (auto const& e : err)
		{
			m_alerts.emplace_alert<listen_failed_alert>(e, lt::address{}, 0
				, operation_t::parse_address, errors::invalid_port, lt::socket_type_t::tcp);
		}

#ifndef TORRENT_DISABLE_LOGGING
		if (should_log())
		{
			session_log("update listen interfaces: %s", net_interfaces.c_str());
			session_log("parsed listen interfaces count: %d, ifaces: %s"
				, int(m_listen_interfaces.size())
				, print_listen_interfaces(m_listen_interfaces).c_str());
		}
#endif
	}